

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::MakeRoomForWrite(DBImpl *this,bool force)

{
  Env *pEVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  uint64_t uVar5;
  Writer *pWVar6;
  MemTable *this_00;
  byte in_DL;
  undefined7 in_register_00000031;
  DBImpl *this_01;
  leveldb local_58 [32];
  Status local_38;
  WritableFile *local_30;
  WritableFile *lfile;
  uint64_t new_log_number;
  bool allow_delay;
  DBImpl *pDStack_18;
  bool force_local;
  DBImpl *this_local;
  Status *s;
  
  this_01 = (DBImpl *)CONCAT71(in_register_00000031,force);
  new_log_number._7_1_ = in_DL & 1;
  pDStack_18 = this_01;
  this_local = this;
  port::Mutex::AssertHeld(&this_01->mutex_);
  bVar2 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::empty
                    (&this_01->writers_);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!writers_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x537,"Status leveldb::DBImpl::MakeRoomForWrite(bool)");
  }
  new_log_number._6_1_ = (new_log_number._7_1_ ^ 0xff) & 1;
  new_log_number._5_1_ = 0;
  Status::Status((Status *)this);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar2 = Status::ok(&this_01->bg_error_);
          if (!bVar2) {
            Status::operator=((Status *)this,&this_01->bg_error_);
            return (Status)(char *)this;
          }
          if (((new_log_number._6_1_ & 1) == 0) ||
             (iVar3 = VersionSet::NumLevelFiles(this_01->versions_,0), iVar3 < 8)) break;
          port::Mutex::Unlock(&this_01->mutex_);
          (*this_01->env_->_vptr_Env[0x16])();
          new_log_number._6_1_ = 0;
          port::Mutex::Lock(&this_01->mutex_);
        }
        if (((new_log_number._7_1_ & 1) == 0) &&
           (sVar4 = MemTable::ApproximateMemoryUsage(this_01->mem_),
           sVar4 <= (this_01->options_).write_buffer_size)) {
          return (Status)(char *)this;
        }
        if (this_01->imm_ == (MemTable *)0x0) break;
        Log((this_01->options_).info_log,"Current memtable full; waiting...\n");
        port::CondVar::Wait(&this_01->background_work_finished_signal_);
      }
      iVar3 = VersionSet::NumLevelFiles(this_01->versions_,0);
      if (iVar3 < 0xc) break;
      Log((this_01->options_).info_log,"Too many L0 files; waiting...\n");
      port::CondVar::Wait(&this_01->background_work_finished_signal_);
    }
    uVar5 = VersionSet::PrevLogNumber(this_01->versions_);
    if (uVar5 != 0) {
      __assert_fail("versions_->PrevLogNumber() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                    ,0x55a,"Status leveldb::DBImpl::MakeRoomForWrite(bool)");
    }
    lfile = (WritableFile *)VersionSet::NewFileNumber(this_01->versions_);
    local_30 = (WritableFile *)0x0;
    pEVar1 = this_01->env_;
    LogFileName(local_58,&this_01->dbname_,(uint64_t)lfile);
    (*pEVar1->_vptr_Env[4])(&local_38,pEVar1,local_58,&local_30);
    Status::operator=((Status *)this,&local_38);
    Status::~Status(&local_38);
    std::__cxx11::string::~string((string *)local_58);
    bVar2 = Status::ok((Status *)this);
    if (!bVar2) break;
    pWVar6 = this_01->log_;
    if (pWVar6 != (Writer *)0x0) {
      log::Writer::~Writer(pWVar6);
      operator_delete(pWVar6);
    }
    if (this_01->logfile_ != (WritableFile *)0x0) {
      (*this_01->logfile_->_vptr_WritableFile[1])();
    }
    this_01->logfile_ = local_30;
    this_01->logfile_number_ = (uint64_t)lfile;
    pWVar6 = (Writer *)operator_new(0x20);
    log::Writer::Writer(pWVar6,local_30);
    this_01->log_ = pWVar6;
    this_01->imm_ = this_01->mem_;
    std::atomic<bool>::store(&this_01->has_imm_,true,memory_order_release);
    this_00 = (MemTable *)operator_new(0x70);
    MemTable::MemTable(this_00,&this_01->internal_comparator_);
    this_01->mem_ = this_00;
    MemTable::Ref(this_01->mem_);
    new_log_number._7_1_ = 0;
    MaybeScheduleCompaction(this_01);
  }
  VersionSet::ReuseFileNumber(this_01->versions_,(uint64_t)lfile);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::MakeRoomForWrite(bool force) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  bool allow_delay = !force;
  Status s;
  while (true) {
    if (!bg_error_.ok()) {
      // Yield previous error
      s = bg_error_;
      break;
    } else if (allow_delay && versions_->NumLevelFiles(0) >=
                                  config::kL0_SlowdownWritesTrigger) {
      // We are getting close to hitting a hard limit on the number of
      // L0 files.  Rather than delaying a single write by several
      // seconds when we hit the hard limit, start delaying each
      // individual write by 1ms to reduce latency variance.  Also,
      // this delay hands over some CPU to the compaction thread in
      // case it is sharing the same core as the writer.
      mutex_.Unlock();
      env_->SleepForMicroseconds(1000);
      allow_delay = false;  // Do not delay a single write more than once
      mutex_.Lock();
    } else if (!force &&
               (mem_->ApproximateMemoryUsage() <= options_.write_buffer_size)) {
      // There is room in current memtable
      break;
    } else if (imm_ != nullptr) {
      // We have filled up the current memtable, but the previous
      // one is still being compacted, so we wait.
      Log(options_.info_log, "Current memtable full; waiting...\n");
      background_work_finished_signal_.Wait();
    } else if (versions_->NumLevelFiles(0) >= config::kL0_StopWritesTrigger) {
      // There are too many level-0 files.
      Log(options_.info_log, "Too many L0 files; waiting...\n");
      background_work_finished_signal_.Wait();
    } else {
      // Attempt to switch to a new memtable and trigger compaction of old
      assert(versions_->PrevLogNumber() == 0);
      uint64_t new_log_number = versions_->NewFileNumber();
      WritableFile* lfile = nullptr;
      s = env_->NewWritableFile(LogFileName(dbname_, new_log_number), &lfile);
      if (!s.ok()) {
        // Avoid chewing through file number space in a tight loop.
        versions_->ReuseFileNumber(new_log_number);
        break;
      }
      delete log_;
      delete logfile_;
      logfile_ = lfile;
      logfile_number_ = new_log_number;
      log_ = new log::Writer(lfile);
      imm_ = mem_;
      has_imm_.store(true, std::memory_order_release);
      mem_ = new MemTable(internal_comparator_);
      mem_->Ref();
      force = false;  // Do not force another compaction if have room
      MaybeScheduleCompaction();
    }
  }
  return s;
}